

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_encode_and_decode_Test::TestBody
          (LoginMessageTest_test_encode_and_decode_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper AStack_7e8;
  AssertionResult gtest_ar_1;
  long *local_7d0 [2];
  long local_7c0 [2];
  long *local_7b0 [2];
  long local_7a0 [2];
  long *local_790 [2];
  long local_780 [2];
  long *local_770 [2];
  long local_760 [2];
  long *local_750 [2];
  long local_740 [2];
  long *local_730 [2];
  long local_720 [2];
  long *local_710 [2];
  long local_700 [2];
  long *local_6f0 [2];
  long local_6e0 [2];
  long *local_6d0 [2];
  long local_6c0 [2];
  long *local_6b0 [2];
  long local_6a0 [2];
  long *local_690 [2];
  long local_680 [2];
  long *local_670 [2];
  long local_660 [2];
  long *local_650 [2];
  long local_640 [2];
  long *local_630 [2];
  long local_620 [2];
  long *local_610 [2];
  long local_600 [2];
  long *local_5f0 [2];
  long local_5e0 [2];
  long *local_5d0 [2];
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [2];
  long *local_590 [2];
  long local_580 [2];
  long *local_570 [2];
  long local_560 [2];
  long *local_550 [2];
  long local_540 [2];
  long *local_530 [2];
  long local_520 [2];
  long *local_510 [2];
  long local_500 [2];
  long *local_4f0 [2];
  long local_4e0 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0 [37];
  LoginMessage message1;
  LoginMessage message2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278 [36];
  LoginMessage message3;
  
  EncodeAndDecode((pixie *)&message1,(LoginMessage *)login_message);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&message2,"login_message","EncodeAndDecode(login_message)",
             (LoginMessage *)login_message,&message1);
  LoginMessage::~LoginMessage(&message1);
  if (message2 == (LoginMessage)0x0) {
    testing::Message::Message((Message *)&message1);
    if (local_278[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_278[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&message3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&message3,(Message *)&message1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message3);
    if (_message1 != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (_message1 != (long *)0x0)) {
        (**(code **)(*_message1 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_278,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"mcandate","");
  local_650[0] = local_640;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_650,PASSWORD_abi_cxx11_,DAT_002a0a20 + PASSWORD_abi_cxx11_);
  local_670[0] = local_660;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_670,ALIAS_abi_cxx11_,DAT_002a0a40 + ALIAS_abi_cxx11_);
  local_690[0] = local_680;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_690,APPLICATION_abi_cxx11_,DAT_002a09c0 + APPLICATION_abi_cxx11_);
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6b0,APPLICATION_VERSION_abi_cxx11_,
             DAT_002a09e0 + APPLICATION_VERSION_abi_cxx11_);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f0,API_abi_cxx11_,DAT_002a0a60 + API_abi_cxx11_);
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_510,API_VERSION_abi_cxx11_,DAT_002a0a80 + API_VERSION_abi_cxx11_);
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_530,PRODUCT_SERIAL_NUMBER_abi_cxx11_,
             DAT_002a0aa0 + PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message1,local_630,local_650,local_670,local_690,local_6b0,(string *)local_4f0,
             (string *)local_510,(string *)local_530);
  if (local_530[0] != local_520) {
    operator_delete(local_530[0],local_520[0] + 1);
  }
  if (local_510[0] != local_500) {
    operator_delete(local_510[0],local_500[0] + 1);
  }
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  if (local_6b0[0] != local_6a0) {
    operator_delete(local_6b0[0],local_6a0[0] + 1);
  }
  if (local_690[0] != local_680) {
    operator_delete(local_690[0],local_680[0] + 1);
  }
  if (local_670[0] != local_660) {
    operator_delete(local_670[0],local_660[0] + 1);
  }
  if (local_650[0] != local_640) {
    operator_delete(local_650[0],local_640[0] + 1);
  }
  if (local_630[0] != local_620) {
    operator_delete(local_630[0],local_620[0] + 1);
  }
  local_6d0[0] = local_6c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6d0,USERNAME_abi_cxx11_,DAT_002a0a00 + USERNAME_abi_cxx11_);
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"g1veMes0Mehoney","");
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6f0,ALIAS_abi_cxx11_,DAT_002a0a40 + ALIAS_abi_cxx11_);
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_710,APPLICATION_abi_cxx11_,DAT_002a09c0 + APPLICATION_abi_cxx11_);
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,APPLICATION_VERSION_abi_cxx11_,
             DAT_002a09e0 + APPLICATION_VERSION_abi_cxx11_);
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_610,API_abi_cxx11_,DAT_002a0a60 + API_abi_cxx11_);
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_550,API_VERSION_abi_cxx11_,DAT_002a0a80 + API_VERSION_abi_cxx11_);
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_570,PRODUCT_SERIAL_NUMBER_abi_cxx11_,
             DAT_002a0aa0 + PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message2,local_6d0,local_5f0,local_6f0,local_710,local_730,(string *)local_610,
             (string *)local_550,(string *)local_570);
  if (local_570[0] != local_560) {
    operator_delete(local_570[0],local_560[0] + 1);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0],local_540[0] + 1);
  }
  if (local_610[0] != local_600) {
    operator_delete(local_610[0],local_600[0] + 1);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],local_720[0] + 1);
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],local_700[0] + 1);
  }
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0],local_6e0[0] + 1);
  }
  if (local_5f0[0] != local_5e0) {
    operator_delete(local_5f0[0],local_5e0[0] + 1);
  }
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0],local_6c0[0] + 1);
  }
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_750,USERNAME_abi_cxx11_,DAT_002a0a00 + USERNAME_abi_cxx11_);
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_770,PASSWORD_abi_cxx11_,DAT_002a0a20 + PASSWORD_abi_cxx11_);
  local_790[0] = local_780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"matteo","");
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7b0,APPLICATION_abi_cxx11_,DAT_002a09c0 + APPLICATION_abi_cxx11_);
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7d0,APPLICATION_VERSION_abi_cxx11_,
             DAT_002a09e0 + APPLICATION_VERSION_abi_cxx11_);
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_590,API_abi_cxx11_,DAT_002a0a60 + API_abi_cxx11_);
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,API_VERSION_abi_cxx11_,DAT_002a0a80 + API_VERSION_abi_cxx11_);
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5d0,PRODUCT_SERIAL_NUMBER_abi_cxx11_,
             DAT_002a0aa0 + PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message3,local_750,local_770,local_790,local_7b0,local_7d0,(string *)local_590,
             (string *)local_5b0,(string *)local_5d0);
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0],local_5c0[0] + 1);
  }
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0],local_5a0[0] + 1);
  }
  if (local_590[0] != local_580) {
    operator_delete(local_590[0],local_580[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0],local_7a0[0] + 1);
  }
  if (local_790[0] != local_780) {
    operator_delete(local_790[0],local_780[0] + 1);
  }
  if (local_770[0] != local_760) {
    operator_delete(local_770[0],local_760[0] + 1);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  EncodeAndDecode((pixie *)local_4d0,&message1);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message1)",
             (LoginMessage *)login_message,(LoginMessage *)local_4d0);
  LoginMessage::~LoginMessage((LoginMessage *)local_4d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_7e8,(Message *)local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_7e8);
    if (local_4d0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_4d0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_4d0[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  EncodeAndDecode((pixie *)local_4d0,&message2);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message2)",
             (LoginMessage *)login_message,(LoginMessage *)local_4d0);
  LoginMessage::~LoginMessage((LoginMessage *)local_4d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_7e8,(Message *)local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_7e8);
    if (local_4d0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_4d0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_4d0[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  EncodeAndDecode((pixie *)local_4d0,&message3);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message3)",
             (LoginMessage *)login_message,(LoginMessage *)local_4d0);
  LoginMessage::~LoginMessage((LoginMessage *)local_4d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_7e8,(Message *)local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_7e8);
    if (local_4d0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_4d0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_4d0[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  LoginMessage::~LoginMessage(&message3);
  LoginMessage::~LoginMessage(&message2);
  LoginMessage::~LoginMessage(&message1);
  return;
}

Assistant:

TEST(LoginMessageTest, test_encode_and_decode)
{
    EXPECT_EQ(login_message, EncodeAndDecode(login_message));
    LoginMessage message1("mcandate", PASSWORD, ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message2(USERNAME, "g1veMes0Mehoney", ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message3(USERNAME, PASSWORD, "matteo", APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    EXPECT_NE(login_message, EncodeAndDecode(message1));
    EXPECT_NE(login_message, EncodeAndDecode(message2));
    EXPECT_NE(login_message, EncodeAndDecode(message3));
}